

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1_fib.cpp
# Opt level: O2

int main(void)

{
  size_t sVar1;
  size_t sVar2;
  ByteCode bc;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_5d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  _Vector_base<ag::Type,_std::allocator<ag::Type>_> local_598;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  _Vector_base<ag::Type,_std::allocator<ag::Type>_> local_558;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  Generator local_480;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  undefined1 local_328;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  undefined1 local_300;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  undefined1 local_2d8;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  undefined1 local_2b0;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  undefined1 local_288;
  _Variadic_union<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  undefined1 local_260;
  string local_258;
  string local_238;
  ofstream file;
  
  local_480.Function.m_gen = &local_480;
  memset(&local_480.Function.m_cur,0,0x98);
  memset(&local_480.m_strtbl,0,0x90);
  local_480.m_ver_major = '\x01';
  local_480.m_ver_minor = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"a",(allocator<char> *)&file);
  sVar1 = ag::Generator::AddGlobal(&local_480,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"main",(allocator<char> *)&file);
  local_558._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ag::Generator::FunctionManager::Create
            (&local_480.Function,&local_4c0,'\0',
             (vector<ag::Type,_std::allocator<ag::Type>_> *)&local_558,&local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_578);
  std::_Vector_base<ag::Type,_std::allocator<ag::Type>_>::~_Vector_base(&local_558);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"fib",(allocator<char> *)&file);
  local_598._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ag::Generator::FunctionManager::Create
            (&local_480.Function,&local_4e0,'\x01',
             (vector<ag::Type,_std::allocator<ag::Type>_> *)&local_598,&local_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5b8);
  std::_Vector_base<ag::Type,_std::allocator<ag::Type>_>::~_Vector_base(&local_598);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"fib",(allocator<char> *)&file);
  ag::Generator::FunctionManager::SetCurrent(&local_480.Function,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  local_280._M_rest._0_4_ = (undefined4)0;
  local_260 = 2;
  ag::Generator::FunctionManager::PushStack(&local_480.Function,(agvariant *)&local_280._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_280._M_first);
  ag::Generator::FunctionManager::GetArgumentPointer(&local_480.Function,0);
  ag::Generator::FunctionManager::Equal(&local_480.Function);
  sVar2 = ag::Generator::FunctionManager::If(&local_480.Function);
  local_2a8._M_rest._0_4_ = (undefined4)0;
  local_288 = 2;
  ag::Generator::FunctionManager::PushStack(&local_480.Function,(agvariant *)&local_2a8._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_2a8._M_first);
  ag::Generator::FunctionManager::Return(&local_480.Function);
  local_480.Function.m_linkAddr.
  super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[local_480.Function.m_cur].
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start[sVar2].second =
       (long)local_480.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_480.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_480.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_480.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_2d0._M_rest._0_4_ = (undefined4)1;
  local_2b0 = 2;
  ag::Generator::FunctionManager::PushStack(&local_480.Function,(agvariant *)&local_2d0._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_2d0._M_first);
  ag::Generator::FunctionManager::GetArgumentPointer(&local_480.Function,0);
  ag::Generator::FunctionManager::Equal(&local_480.Function);
  sVar2 = ag::Generator::FunctionManager::If(&local_480.Function);
  local_2f8._M_rest._0_4_ = (undefined4)1;
  local_2d8 = 2;
  ag::Generator::FunctionManager::PushStack(&local_480.Function,(agvariant *)&local_2f8._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_2f8._M_first);
  ag::Generator::FunctionManager::Return(&local_480.Function);
  local_480.Function.m_linkAddr.
  super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[local_480.Function.m_cur].
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start[sVar2].second =
       (long)local_480.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_480.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_480.Function.m_code.
             super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start[local_480.Function.m_cur].m_bytes.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  ag::Generator::FunctionManager::GetArgumentPointer(&local_480.Function,0);
  local_320._M_rest._0_4_ = (undefined4)1;
  local_300 = 2;
  ag::Generator::FunctionManager::PushStack(&local_480.Function,(agvariant *)&local_320._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_320._M_first);
  ag::Generator::FunctionManager::Subtract(&local_480.Function);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"fib",(allocator<char> *)&file);
  ag::Generator::FunctionManager::CallReturn(&local_480.Function,&local_500,'\x01');
  std::__cxx11::string::~string((string *)&local_500);
  ag::Generator::FunctionManager::GetArgumentPointer(&local_480.Function,0);
  local_348._M_rest._0_4_ = (undefined4)2;
  local_328 = 2;
  ag::Generator::FunctionManager::PushStack(&local_480.Function,(agvariant *)&local_348._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_348._M_first);
  ag::Generator::FunctionManager::Subtract(&local_480.Function);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"fib",(allocator<char> *)&file);
  ag::Generator::FunctionManager::CallReturn(&local_480.Function,&local_520,'\x01');
  std::__cxx11::string::~string((string *)&local_520);
  ag::Generator::FunctionManager::Add(&local_480.Function);
  ag::Generator::FunctionManager::Return(&local_480.Function);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"main",(allocator<char> *)&file);
  ag::Generator::FunctionManager::SetCurrent(&local_480.Function,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  ag::Generator::FunctionManager::GetGlobal(&local_480.Function,(uint16_t)sVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"fib",(allocator<char> *)&file);
  ag::Generator::FunctionManager::CallReturn(&local_480.Function,&local_540,'\x01');
  std::__cxx11::string::~string((string *)&local_540);
  ag::Generator::FunctionManager::Return(&local_480.Function);
  ag::Generator::Get(&bc,&local_480);
  std::ofstream::ofstream(&file,"fib.bv",_S_out|_S_bin);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5d0,&bc.m_bytes);
  std::ostream::write((char *)&file,(long)local_5d0._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_5d0);
  std::ofstream::~ofstream(&file);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bc);
  ag::Generator::~Generator(&local_480);
  return 0;
}

Assistant:

int main() {
	ag::Generator gen;

	// header - version
	gen.SetHeader(1, 0);

	size_t nid = gen.AddGlobal("a");

	gen.Function.Create("main");	// define main()
	gen.Function.Create("fib", 1);	// define fib(a)

	gen.Function.SetCurrent("fib");
		gen.Function.PushStack(0);			// 0
		gen.Function.GetArgumentPointer(0);	// arg0 0
		gen.Function.Equal();				// arg0 == 0
		size_t if1 = gen.Function.If();		// if (arg0 == 0)
			gen.Function.PushStack(0);		// 0
			gen.Function.Return();			// return 0;
		gen.Function.SetAddress(if1, gen.Function.GetCurrentAddress());

		gen.Function.PushStack(1);			// 1
		gen.Function.GetArgumentPointer(0);	// arg0 1
		gen.Function.Equal();				// arg0 == 1
		size_t if2 = gen.Function.If();		// if (arg0 == 1)
			gen.Function.PushStack(1);		// 1
			gen.Function.Return();			// return 1;
		gen.Function.SetAddress(if2, gen.Function.GetCurrentAddress());

		gen.Function.GetArgumentPointer(0);	// &arg0
		gen.Function.PushStack(1);			// 1 arg0
		gen.Function.Subtract();			// arg0 - 1
		gen.Function.CallReturn("fib", 1);	// fib(arg0 - 1)

		gen.Function.GetArgumentPointer(0);	// &arg0 fib(arg0 - 1)
		gen.Function.PushStack(2);			// 2 arg0 fib(arg0 - 1)
		gen.Function.Subtract();			// arg0-2 fib(arg0 - 1)
		gen.Function.CallReturn("fib", 1);	// fib(arg0 - 2) fib(arg0 - 1)

		gen.Function.Add();					// fib(arg0 - 1) + fib(arg0 - 2)

		gen.Function.Return();				// return fib(arg0 - 1) + fiv(arg0 - 2);

	gen.Function.SetCurrent("main");
		gen.Function.GetGlobal(nid);		// a
		gen.Function.CallReturn("fib", 1);	// fib(a)
		gen.Function.Return();				// return fib(a)

	ag::ByteCode bc = gen.Get();	// get bytecode

	std::ofstream file("fib.bv", std::ios::out | std::ios::binary);
	file.write(reinterpret_cast<const char *>(bc.Get().data()), bc.Count());

	return 0;
}